

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.hpp
# Opt level: O1

RealType __thiscall OpenMD::SelectionEvaluator::getSurfaceArea(SelectionEvaluator *this)

{
  if (this->hasSurfaceArea_ == true) {
    return this->surfaceArea_;
  }
  snprintf(painCave.errMsg,2000,"SelectionEvaluator Error: %s\n","No Surface Area For You!");
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  return 0.0;
}

Assistant:

RealType getSurfaceArea() {
      if (hasSurfaceArea_) {
        return surfaceArea_;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "SelectionEvaluator Error: %s\n", "No Surface Area For You!");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
        return 0.0;
      }
    }